

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzhierarquicalgrid.cpp
# Opt level: O0

TPZHierarquicalGrid * __thiscall
TPZHierarquicalGrid::operator=(TPZHierarquicalGrid *this,TPZHierarquicalGrid *other)

{
  TPZAutoPointer<TPZGeoMesh> *in_RSI;
  TPZHierarquicalGrid *in_RDI;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_> *unaff_retaddr;
  TPZHierarquicalGrid *copy;
  
  copy = in_RDI;
  std::__cxx11::string::operator=((string *)&in_RDI->fFileName,(string *)(in_RSI + 3));
  in_RDI->fNonAffineQ = (bool)(*(byte *)&in_RSI[1].fRef & 1);
  in_RDI->fIsQuad = (bool)(*(byte *)((long)&in_RSI[1].fRef + 1) & 1);
  in_RDI->fIsPrism = (bool)(*(byte *)((long)&in_RSI[1].fRef + 2) & 1);
  in_RDI->fIsTetrahedron = (bool)(*(byte *)((long)&in_RSI[1].fRef + 3) & 1);
  in_RDI->fComputedGeomesh = (TPZGeoMesh *)in_RSI[7].fRef;
  in_RDI->ffrontMatID = *(int *)((long)&in_RSI[1].fRef + 4);
  in_RDI->fbackMatID = *(int *)&in_RSI[2].fRef;
  TPZVec<TPZAutoPointer<TPZGeoMesh>_>::operator=
            (unaff_retaddr,(TPZVec<TPZAutoPointer<TPZGeoMesh>_> *)copy);
  TPZAutoPointer<TPZGeoMesh>::operator=((TPZAutoPointer<TPZGeoMesh> *)copy,in_RSI);
  return in_RDI;
}

Assistant:

TPZHierarquicalGrid& TPZHierarquicalGrid::operator=(const TPZHierarquicalGrid& other)
{
    fFileName   = other.fFileName;
    fNonAffineQ = other.fNonAffineQ;
    fIsQuad = other.fIsQuad;
    fIsPrism = other.fIsPrism;
    fIsTetrahedron = other.fIsTetrahedron;
    fComputedGeomesh = other.fComputedGeomesh;
    ffrontMatID = other.ffrontMatID;
    fbackMatID = other.fbackMatID;
    fSubBases = other.fSubBases;
    fBase = other.fBase;
    return *this;
}